

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O1

iterator __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::begin(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *this)

{
  ulong *puVar1;
  ulong uVar2;
  Node *pNVar3;
  ulong uVar4;
  ulong *puVar5;
  iterator iVar6;
  iterator iVar7;
  
  if (this->mNumElements != 0) {
    pNVar3 = this->mKeyVals;
    puVar5 = (ulong *)this->mInfo;
    uVar4 = *puVar5;
    while (uVar4 == 0) {
      pNVar3 = pNVar3 + 8;
      puVar1 = puVar5 + 1;
      puVar5 = puVar5 + 1;
      uVar4 = *puVar1;
    }
    uVar2 = 0;
    if (uVar4 != 0) {
      for (; (uVar4 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
      }
    }
    uVar4 = uVar2 >> 3 & 0x1fffffff;
    iVar6.mInfo = (uint8_t *)((long)puVar5 + uVar4);
    iVar6.mKeyVals = pNVar3 + uVar4;
    return iVar6;
  }
  iVar7.mInfo = (uint8_t *)0x0;
  iVar7.mKeyVals = (NodePtr)this->mInfo;
  return iVar7;
}

Assistant:

bool empty() const noexcept {
        ROBIN_HOOD_TRACE(this)
        return 0 == mNumElements;
    }